

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

void __thiscall cppurses::Terminal::ncurses_set_palette(Terminal *this,Palette *colors)

{
  short sVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = can_change_colors(this);
  if (bVar2) {
    for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 8) {
      sVar1 = *(short *)((long)&colors->_M_elems[0].color + lVar3);
      if ((int)sVar1 < (int)((uint)(byte)(0xf < _COLORS & this->is_initialized_) * 8 + 8)) {
        init_color((int)sVar1,
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.red
                                                             + lVar3) / 255.0) * 1000.0),
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.
                                                                     green + lVar3) / 255.0) *
                                    1000.0),
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.blue
                                                             + lVar3) / 255.0) * 1000.0));
      }
    }
  }
  return;
}

Assistant:

void Terminal::ncurses_set_palette(const Palette& colors)
{
    if (this->can_change_colors()) {
        for (const Color_definition& def : colors) {
            const auto max_color = this->has_extended_colors() ? 16 : 8;
            const auto ncurses_color_number =
                static_cast<Underlying_color_t>(def.color);
            if (ncurses_color_number < max_color) {
                ::init_color(ncurses_color_number, scale(def.values.red),
                             scale(def.values.green), scale(def.values.blue));
            }
        }
    }
}